

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepEdge.hxx
# Opt level: O0

Unique<BrepEdge> __thiscall anurbs::BrepEdge::load(BrepEdge *this,Model *model,Json *data)

{
  undefined8 uVar1;
  const_reference pvVar2;
  pointer pBVar3;
  size_type sVar4;
  reference this_00;
  string local_c8 [32];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  string key;
  size_t i;
  allocator<char> local_59;
  key_type local_58;
  undefined1 local_38 [8];
  value_type trims;
  Json *data_local;
  Model *model_local;
  Unique<anurbs::BrepEdge> *result;
  
  trims.m_value.number_integer._7_1_ = 0;
  new_<anurbs::BrepEdge>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"trims",&local_59);
  pvVar2 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(data,&local_58);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_38,pvVar2);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pBVar3 = std::unique_ptr<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>_>::operator->
                     ((unique_ptr<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>_> *)this);
  sVar4 = nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_38);
  std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
  resize(&pBVar3->m_trims,sVar4);
  for (key.field_2._8_8_ = 0; uVar1 = key.field_2._8_8_,
      sVar4 = nlohmann::
              basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::size((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_38), (ulong)uVar1 < sVar4; key.field_2._8_8_ = key.field_2._8_8_ + 1)
  {
    pvVar2 = nlohmann::
             basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[]((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_38,key.field_2._8_8_);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,pvVar2)
    ;
    std::__cxx11::string::string(local_c8,(string *)local_98);
    Model::get_lazy<anurbs::BrepTrim>((Model *)local_a8,(string *)model);
    pBVar3 = std::unique_ptr<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>_>::operator->
                       ((unique_ptr<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>_> *)this
                       );
    this_00 = std::
              vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
              ::operator[](&pBVar3->m_trims,key.field_2._8_8_);
    Ref<anurbs::BrepTrim>::operator=(this_00,(Ref<anurbs::BrepTrim> *)local_a8);
    Ref<anurbs::BrepTrim>::~Ref((Ref<anurbs::BrepTrim> *)local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)local_98);
  }
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_38);
  return (__uniq_ptr_data<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>,_true,_true>)
         (__uniq_ptr_data<anurbs::BrepEdge,_std::default_delete<anurbs::BrepEdge>,_true,_true>)this;
}

Assistant:

Unique<BrepEdge> BrepEdge::load(Model& model, const Json& data)
{
    auto result = new_<BrepEdge>();

    // Read trims
    {
        const auto trims = data.at("trims");

        result->m_trims.resize(trims.size());

        for (size_t i = 0; i < trims.size(); i++) {
            const std::string key = trims[i];
            result->m_trims[i] = model.get_lazy<BrepTrim>(key);
        }
    }

    return result;
}